

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::VertexAttributePointerCase::test
          (VertexAttributePointerCase *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLfloat vertexData [4];
  StateQueryMemoryWriteGuard<void_*> state;
  PointerData pointers [10];
  StateQueryMemoryWriteGuard<void_*> initialState;
  undefined8 local_168;
  undefined8 uStack_160;
  StateQueryMemoryWriteGuard<void_*> local_158;
  GLsizei GStack_140;
  GLboolean aGStack_13c [4];
  undefined8 local_138;
  undefined4 local_130;
  undefined1 local_12c;
  undefined8 *local_128;
  undefined8 local_120;
  undefined4 local_118;
  undefined1 local_114;
  long local_110;
  undefined8 local_108;
  undefined4 local_100;
  undefined1 local_fc;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined1 local_e4;
  long local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined1 local_cc;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined1 local_b4;
  long local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined1 local_9c;
  undefined8 *local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined1 local_84;
  undefined8 *local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined1 local_6c;
  long local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined1 local_54;
  undefined8 *local_50;
  StateQueryMemoryWriteGuard<void_*> local_48;
  
  local_48.m_postguard = (void *)0xdededededededede;
  local_48.m_preguard = (void *)0xdededededededede;
  local_48.m_value = (void *)0xdededededededede;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetVertexAttribPointerv(this_00,0,0x8645,&local_48.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
            (&local_48,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
  ;
  checkPointerEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     local_48.m_value,(void *)0x0);
  local_168 = 0;
  uStack_160 = 0;
  local_138 = 0x140000000001;
  local_130 = 0;
  local_12c = 0;
  local_128 = &uStack_160;
  local_120 = 0x140200000001;
  local_118 = 0;
  local_114 = 0;
  local_110 = (long)&local_168 + 4;
  local_108 = 0x140c00000001;
  local_100 = 0;
  local_fc = 0;
  local_f8 = &uStack_160;
  local_f0 = 0x140c00000001;
  local_e8 = 0;
  local_e4 = 0;
  local_e0 = local_110;
  local_d8 = 0x140600000001;
  local_d0 = 0;
  local_cc = 0;
  local_c8 = &local_168;
  local_c0 = 0x140600000001;
  local_b8 = 0;
  local_b4 = 0;
  local_b0 = (long)&uStack_160 + 4;
  local_a8 = 0x140600000001;
  local_a0 = 0;
  local_9c = 0;
  local_98 = &uStack_160;
  local_90 = 0x140300000001;
  local_88 = 0;
  local_84 = 0;
  local_80 = &local_168;
  local_78 = 0x140300000004;
  local_70 = 0;
  local_6c = 0;
  local_68 = local_110;
  local_60 = 0x140300000004;
  local_58 = 0;
  local_54 = 0;
  local_50 = &uStack_160;
  lVar1 = 0x10;
  do {
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)((long)&local_158.m_postguard + lVar1),
               *(GLenum *)((long)&local_158.m_postguard + lVar1 + 4),aGStack_13c[lVar1],
               *(GLsizei *)((long)&GStack_140 + lVar1),*(void **)((long)&local_138 + lVar1));
    ApiCase::expectError(&this->super_ApiCase,0);
    local_158.m_postguard = (void *)0xdededededededede;
    local_158.m_preguard = (void *)0xdededededededede;
    local_158.m_value = (void *)0xdededededededede;
    glu::CallLogWrapper::glGetVertexAttribPointerv(this_00,0,0x8645,&local_158.m_value);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
              (&local_158,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    checkPointerEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       local_158.m_value,*(void **)((long)&local_138 + lVar1));
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

void test (void)
	{
		StateQueryMemoryWriteGuard<GLvoid*> initialState;
		glGetVertexAttribPointerv(0, GL_VERTEX_ATTRIB_ARRAY_POINTER, &initialState);
		initialState.verifyValidity(m_testCtx);
		checkPointerEquals(m_testCtx, initialState, 0);

		GLfloat vertexData[4] = {0.0f}; // never accessed
		const PointerData pointers[] =
		{
			{ 1, GL_BYTE,				0,	GL_FALSE, &vertexData[2] },
			{ 1, GL_SHORT,				0,	GL_FALSE, &vertexData[1] },
			{ 1, GL_FIXED,				0,	GL_FALSE, &vertexData[2] },
			{ 1, GL_FIXED,				0,	GL_FALSE, &vertexData[1] },
			{ 1, GL_FLOAT,				0,	GL_FALSE, &vertexData[0] },
			{ 1, GL_FLOAT,				0,	GL_FALSE, &vertexData[3] },
			{ 1, GL_FLOAT,				0,	GL_FALSE, &vertexData[2] },
			{ 1, GL_UNSIGNED_SHORT,		0,	GL_FALSE, &vertexData[0] },
			{ 4, GL_UNSIGNED_SHORT,		0,	GL_FALSE, &vertexData[1] },
			{ 4, GL_UNSIGNED_SHORT,		0,	GL_FALSE, &vertexData[2] },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
		{
			glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLvoid*> state;
			glGetVertexAttribPointerv(0, GL_VERTEX_ATTRIB_ARRAY_POINTER, &state);
			state.verifyValidity(m_testCtx);
			checkPointerEquals(m_testCtx, state, pointers[ndx].pointer);
		}
	}